

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::SocketWriter::MakeConnection(SocketWriter *this)

{
  int iVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  addrinfo *paVar5;
  addrinfo *servinfo;
  GTestLog local_64;
  addrinfo *local_60;
  addrinfo local_58;
  
  if (this->sockfd_ != -1) {
    GTestLog::GTestLog((GTestLog *)&local_58,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/build_O3/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x1369);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition sockfd_ == -1 failed. ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "MakeConnection() can\'t be called when there is already a connection.",0x44);
    GTestLog::~GTestLog((GTestLog *)&local_58);
  }
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 0;
  local_60 = (addrinfo *)0x0;
  iVar1 = getaddrinfo((this->host_name_)._M_dataplus._M_p,(this->port_num_)._M_dataplus._M_p,
                      &local_58,&local_60);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_64,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/build_O3/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x1377);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"stream_result_to: getaddrinfo() failed: ",0x28);
    __s = gai_strerror(iVar1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x16f670);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
    }
    GTestLog::~GTestLog(&local_64);
  }
  paVar5 = local_60;
  if (local_60 != (addrinfo *)0x0 && this->sockfd_ == -1) {
    do {
      iVar2 = socket(paVar5->ai_family,paVar5->ai_socktype,paVar5->ai_protocol);
      this->sockfd_ = iVar2;
      iVar1 = -1;
      if (iVar2 != -1) {
        iVar2 = connect(iVar2,paVar5->ai_addr,paVar5->ai_addrlen);
        iVar1 = this->sockfd_;
        if (iVar2 == -1) {
          close(iVar1);
          this->sockfd_ = -1;
          iVar1 = -1;
        }
      }
    } while ((iVar1 == -1) && (paVar5 = paVar5->ai_next, paVar5 != (addrinfo *)0x0));
  }
  freeaddrinfo(local_60);
  if (this->sockfd_ == -1) {
    GTestLog::GTestLog(&local_64,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/build_O3/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x138c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"stream_result_to: failed to connect to ",0x27);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->host_name_)._M_dataplus._M_p,
                        (this->host_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(this->port_num_)._M_dataplus._M_p,(this->port_num_)._M_string_length);
    GTestLog::~GTestLog(&local_64);
  }
  return;
}

Assistant:

void StreamingListener::SocketWriter::MakeConnection() {
  GTEST_CHECK_(sockfd_ == -1)
      << "MakeConnection() can't be called when there is already a connection.";

  addrinfo hints;
  memset(&hints, 0, sizeof(hints));
  hints.ai_family = AF_UNSPEC;  // To allow both IPv4 and IPv6 addresses.
  hints.ai_socktype = SOCK_STREAM;
  addrinfo* servinfo = nullptr;

  // Use the getaddrinfo() to get a linked list of IP addresses for
  // the given host name.
  const int error_num =
      getaddrinfo(host_name_.c_str(), port_num_.c_str(), &hints, &servinfo);
  if (error_num != 0) {
    GTEST_LOG_(WARNING) << "stream_result_to: getaddrinfo() failed: "
                        << gai_strerror(error_num);
  }

  // Loop through all the results and connect to the first we can.
  for (addrinfo* cur_addr = servinfo; sockfd_ == -1 && cur_addr != nullptr;
       cur_addr = cur_addr->ai_next) {
    sockfd_ = socket(cur_addr->ai_family, cur_addr->ai_socktype,
                     cur_addr->ai_protocol);
    if (sockfd_ != -1) {
      // Connect the client socket to the server socket.
      if (connect(sockfd_, cur_addr->ai_addr, cur_addr->ai_addrlen) == -1) {
        close(sockfd_);
        sockfd_ = -1;
      }
    }
  }

  freeaddrinfo(servinfo);  // all done with this structure

  if (sockfd_ == -1) {
    GTEST_LOG_(WARNING) << "stream_result_to: failed to connect to "
                        << host_name_ << ":" << port_num_;
  }
}